

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MassDensityR.cpp
# Opt level: O2

void __thiscall OpenMD::MassDensityR::process(MassDensityR *this)

{
  SelectionManager *this_00;
  pointer pdVar1;
  int iVar2;
  int iVar3;
  StuntDouble *this_01;
  int whichFrame;
  double dVar4;
  int ii;
  Vector3d pos;
  Vector3d CenterOfMass;
  DumpReader reader;
  int local_12fc;
  SelectionEvaluator *local_12f8;
  Thermo *local_12f0;
  SelectionSet local_12e8;
  Vector<double,_3U> local_12d0;
  Vector<double,_3U> local_12b8;
  Vector<double,_3U> local_12a0;
  DumpReader local_1288;
  
  DumpReader::DumpReader
            (&local_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar2 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar2 / (this->super_StaticAnalyser).step_;
  local_12f0 = &this->thermo_;
  local_12f8 = &this->evaluator_;
  this_00 = &this->seleMan_;
  for (whichFrame = 0; whichFrame < iVar2;
      whichFrame = whichFrame + (this->super_StaticAnalyser).step_) {
    DumpReader::readFrame(&local_1288,whichFrame);
    this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    Thermo::getCom((Vector3d *)&local_12d0,local_12f0);
    if ((this->evaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_12e8,local_12f8);
      SelectionManager::setSelectionSet(this_00,&local_12e8);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_12e8.bitsets_);
    }
    this_01 = SelectionManager::beginSelected(this_00,&local_12fc);
    while (this_01 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_12b8,this_01);
      operator-(&local_12a0,&local_12d0,&local_12b8);
      Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_12e8,&local_12a0);
      dVar4 = Vector<double,_3U>::length((Vector<double,_3U> *)&local_12e8);
      if (dVar4 < this->len_) {
        iVar3 = (int)(dVar4 / this->deltaR_);
        pdVar1 = (this->massR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar1[iVar3] = this_01->mass_ + pdVar1[iVar3];
      }
      this_01 = SelectionManager::nextSelected(this_00,&local_12fc);
    }
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void MassDensityR::process() {
    StuntDouble* sd;
    int ii;

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Vector3d CenterOfMass = thermo_.getCom();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // determine which StuntDouble belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos      = CenterOfMass - sd->getPos();
        RealType distance = pos.length();
        RealType mass     = sd->getMass();

        if (distance < len_) {
          int binNo = int(distance / deltaR_);
          massR_[binNo] += mass;
        }
      }
    }
    writeMassDensityR();
  }